

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_gd2.c
# Opt level: O3

void * gdImageGd2Ptr(gdImagePtr im,int cs,int fmt,int *size)

{
  gdIOCtx *out;
  void *pvVar1;
  
  out = gdNewDynamicCtx(0x800,(void *)0x0);
  if (out == (gdIOCtx *)0x0) {
    pvVar1 = (void *)0x0;
  }
  else {
    _gdImageGd2(im,out,cs,fmt);
    pvVar1 = gdDPExtractData(out,size);
    (*out->gd_free)(out);
  }
  return pvVar1;
}

Assistant:

BGD_DECLARE(void *) gdImageGd2Ptr (gdImagePtr im, int cs, int fmt, int *size)
{
	void *rv;
	gdIOCtx *out = gdNewDynamicCtx (2048, NULL);
	if (out == NULL) return NULL;
	_gdImageGd2 (im, out, cs, fmt);
	rv = gdDPExtractData (out, size);
	out->gd_free (out);
	return rv;
}